

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder_utils.c
# Opt level: O0

Qiniu_Error
Qiniu_Utils_Generate_RecorderKey
          (char *uptoken,char *version,char *key,char *localFile,char **pRecorderKey)

{
  Qiniu_Bool QVar1;
  char *pcVar2;
  int *piVar3;
  Qiniu_Error QVar4;
  Qiniu_Recorder_Key_Generator local_1070;
  Qiniu_Recorder_Key_Generator recorderKeyGenerator;
  Qiniu_Error err;
  char *accessKey;
  char *bucket;
  char fullPath [4096];
  char **pRecorderKey_local;
  char *localFile_local;
  char *key_local;
  char *version_local;
  char *uptoken_local;
  char *local_10;
  
  QVar1 = Qiniu_Utils_Extract_Bucket(uptoken,&err.message,&accessKey);
  if (QVar1 == 0) {
    uptoken_local = (char *)0x190;
    local_10 = "parse uptoken failed";
  }
  else {
    pcVar2 = _realpath(localFile,(char *)&bucket);
    if (pcVar2 == (char *)0x0) {
      piVar3 = __errno_location();
      uptoken_local = (char *)(ulong)(uint)-*piVar3;
      local_10 = "realpath() error";
    }
    else {
      local_1070 = Qiniu_Recorder_Key_Generator_New();
      Qiniu_Recorder_Key_Generator_Append(&local_1070,version);
      Qiniu_Recorder_Key_Generator_Append(&local_1070,err.message);
      Qiniu_Recorder_Key_Generator_Append(&local_1070,accessKey);
      Qiniu_Recorder_Key_Generator_Append(&local_1070,(char *)&bucket);
      if (key != (char *)0x0) {
        Qiniu_Recorder_Key_Generator_Append(&local_1070,key);
      }
      Qiniu_FreeV2(&accessKey);
      Qiniu_FreeV2(&err.message);
      if (pRecorderKey != (char **)0x0) {
        pcVar2 = Qiniu_Recorder_Key_Generator_Generate(&local_1070);
        *pRecorderKey = pcVar2;
      }
      Qiniu_Recorder_Key_Generator_Free(local_1070);
      uptoken_local = (char *)Qiniu_OK._0_8_;
      local_10 = Qiniu_OK.message;
    }
  }
  QVar4._0_8_ = (ulong)uptoken_local & 0xffffffff;
  QVar4.message = local_10;
  return QVar4;
}

Assistant:

Qiniu_Error Qiniu_Utils_Generate_RecorderKey(const char *uptoken, const char *version, const char *key, const char *localFile, const char **pRecorderKey)
{
	char fullPath[PATH_MAX];
	const char *bucket, *accessKey;
	Qiniu_Error err;
	if (!Qiniu_Utils_Extract_Bucket(uptoken, &accessKey, &bucket))
	{
		err.code = 400;
		err.message = "parse uptoken failed";
		return err;
	}
	if (_realpath(localFile, fullPath) == NULL)
	{
		err.code = -errno;
		err.message = "realpath() error";
		return err;
	}

	Qiniu_Recorder_Key_Generator recorderKeyGenerator = Qiniu_Recorder_Key_Generator_New();
	Qiniu_Recorder_Key_Generator_Append(&recorderKeyGenerator, version);
	Qiniu_Recorder_Key_Generator_Append(&recorderKeyGenerator, accessKey);
	Qiniu_Recorder_Key_Generator_Append(&recorderKeyGenerator, bucket);
	Qiniu_Recorder_Key_Generator_Append(&recorderKeyGenerator, fullPath);
	if (key != NULL)
	{
		Qiniu_Recorder_Key_Generator_Append(&recorderKeyGenerator, key);
	}

	Qiniu_FreeV2((void **)&bucket);
	Qiniu_FreeV2((void **)&accessKey);

	if (pRecorderKey != NULL)
	{
		*pRecorderKey = Qiniu_Recorder_Key_Generator_Generate(&recorderKeyGenerator);
	}
	Qiniu_Recorder_Key_Generator_Free(recorderKeyGenerator);
	return Qiniu_OK;
}